

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.cpp
# Opt level: O2

void __thiscall gui::MenuBar::setMenu(MenuBar *this,MenuList *menu,size_t index)

{
  pointer pMVar1;
  ulong uVar2;
  
  pMVar1 = (this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar2 = ((long)(this->menus_).super__Vector_base<gui::MenuList,_std::allocator<gui::MenuList>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)pMVar1) / 0x50;
  if (uVar2 < index) {
    index = uVar2;
  }
  MenuList::operator=(pMVar1 + index,menu);
  updateMenuBar(this);
  selectMenu(this,this->selectedMenu_,false);
  return;
}

Assistant:

void MenuBar::setMenu(const MenuList& menu, size_t index) {
    menus_[std::min(index, menus_.size())] = menu;
    updateMenuBar();
    selectMenu(selectedMenu_, false);
}